

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

Position __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IndexOfLength(CordRepBtree *this,size_t n)

{
  Position PVar1;
  ulong local_38;
  size_t strip;
  size_t index;
  size_t n_local;
  CordRepBtree *this_local;
  
  if (n <= (this->super_CordRep).length) {
    strip = back(this);
    local_38 = (this->super_CordRep).length - n;
    while (this->edges_[strip]->length <= local_38) {
      local_38 = local_38 - this->edges_[strip]->length;
      strip = strip - 1;
    }
    PVar1.n = this->edges_[strip]->length - local_38;
    PVar1.index = strip;
    return PVar1;
  }
  __assert_fail("n <= length",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x340,
                "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOfLength(size_t) const"
               );
}

Assistant:

inline CordRepBtree::Position CordRepBtree::IndexOfLength(size_t n) const {
  assert(n <= length);
  size_t index = back();
  size_t strip = length - n;
  while (strip >= edges_[index]->length) strip -= edges_[index--]->length;
  return {index, edges_[index]->length - strip};
}